

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_hintmap_insertHint(CF2_HintMap hintmap,CF2_Hint bottomHintEdge,CF2_Hint topHintEdge)

{
  CF2_HintRec *pCVar1;
  int iVar2;
  CF2_HintMap hintmap_00;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  CF2_HintRec *pCVar6;
  FT_UFast FVar7;
  undefined4 uVar8;
  CF2_F16Dot16 CVar9;
  CF2_Hint pCVar10;
  CF2_F16Dot16 *pCVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  CF2_Hint pCVar17;
  bool bVar18;
  bool bVar19;
  
  if (bottomHintEdge->flags == 0) {
    bVar19 = true;
    pCVar17 = topHintEdge;
  }
  else {
    bVar19 = topHintEdge->flags == 0;
    pCVar17 = bottomHintEdge;
  }
  if ((bVar19) || (bottomHintEdge->csCoord <= topHintEdge->csCoord)) {
    uVar16 = hintmap->count;
    bVar18 = uVar16 != 0;
    if (uVar16 == 0) {
      uVar16 = 0;
    }
    else {
      uVar15 = 0;
      if (hintmap->edge[0].csCoord < pCVar17->csCoord) {
        iVar14 = 0;
        pCVar11 = &hintmap->edge[1].csCoord;
        do {
          if (uVar16 + iVar14 == 1) goto LAB_0023b6a6;
          iVar14 = iVar14 + -1;
          iVar2 = *pCVar11;
          pCVar11 = pCVar11 + 8;
        } while (iVar2 < pCVar17->csCoord);
        uVar15 = -iVar14;
        bVar18 = uVar15 < uVar16;
      }
      uVar16 = uVar15;
      if (bVar18) {
        iVar14 = hintmap->edge[uVar15].csCoord;
        if (iVar14 == pCVar17->csCoord) {
          return;
        }
        if ((!bVar19) && (iVar14 <= topHintEdge->csCoord)) {
          return;
        }
        if ((hintmap->edge[uVar15].flags & 8) != 0) {
          return;
        }
      }
    }
LAB_0023b6a6:
    hintmap_00 = hintmap->initialHintMap;
    if ((hintmap_00->isValid != '\0') && ((pCVar17->flags & 0x10) == 0)) {
      iVar14 = pCVar17->csCoord;
      if (bVar19) {
        CVar9 = cf2_hintmap_map(hintmap_00,iVar14);
        pCVar10 = pCVar17;
      }
      else {
        CVar9 = cf2_hintmap_map(hintmap_00,(topHintEdge->csCoord - iVar14) / 2 + iVar14);
        lVar12 = (long)((topHintEdge->csCoord - pCVar17->csCoord) / 2) * (long)hintmap->scale;
        iVar14 = (int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10);
        pCVar17->dsCoord = CVar9 - iVar14;
        CVar9 = CVar9 + iVar14;
        pCVar10 = topHintEdge;
      }
      pCVar10->dsCoord = CVar9;
    }
    if ((uVar16 == 0) || (hintmap->edge[uVar16 - 1].dsCoord <= pCVar17->dsCoord)) {
      uVar15 = hintmap->count;
      if (uVar16 < uVar15) {
        if (bVar19) {
          iVar14 = pCVar17->dsCoord;
        }
        else {
          iVar14 = topHintEdge->dsCoord;
        }
        if (hintmap->edge[uVar16].dsCoord < iVar14) {
          return;
        }
      }
      uVar3 = uVar15 + 1;
      if (bVar19) {
        uVar3 = uVar15;
      }
      uVar13 = uVar15;
      if (uVar3 < 0xc0) {
        while (uVar13 != uVar16) {
          uVar13 = uVar13 - 1;
          pCVar1 = hintmap->edge + uVar13;
          FVar7 = pCVar1->flags;
          uVar8 = *(undefined4 *)&pCVar1->field_0x4;
          sVar4 = pCVar1->index;
          pCVar1 = hintmap->edge + uVar13;
          CVar9 = pCVar1->dsCoord;
          uVar5 = *(undefined8 *)(&pCVar1->csCoord + 2);
          pCVar6 = hintmap->edge + uVar3;
          pCVar6->csCoord = pCVar1->csCoord;
          pCVar6->dsCoord = CVar9;
          *(undefined8 *)(&pCVar6->csCoord + 2) = uVar5;
          pCVar1 = hintmap->edge + uVar3;
          pCVar1->flags = FVar7;
          *(undefined4 *)&pCVar1->field_0x4 = uVar8;
          pCVar1->index = sVar4;
          uVar3 = uVar3 - 1;
        }
        FVar7 = pCVar17->flags;
        uVar8 = *(undefined4 *)&pCVar17->field_0x4;
        sVar4 = pCVar17->index;
        CVar9 = pCVar17->dsCoord;
        uVar5 = *(undefined8 *)&pCVar17->scale;
        pCVar1 = hintmap->edge + uVar16;
        pCVar1->csCoord = pCVar17->csCoord;
        pCVar1->dsCoord = CVar9;
        *(undefined8 *)(&pCVar1->csCoord + 2) = uVar5;
        pCVar1 = hintmap->edge + uVar16;
        pCVar1->flags = FVar7;
        *(undefined4 *)&pCVar1->field_0x4 = uVar8;
        pCVar1->index = sVar4;
        hintmap->count = uVar15 + 1;
        if (!bVar19) {
          FVar7 = topHintEdge->flags;
          uVar8 = *(undefined4 *)&topHintEdge->field_0x4;
          sVar4 = topHintEdge->index;
          CVar9 = topHintEdge->dsCoord;
          uVar5 = *(undefined8 *)&topHintEdge->scale;
          pCVar1 = hintmap->edge + (uVar16 + 1);
          pCVar1->csCoord = topHintEdge->csCoord;
          pCVar1->dsCoord = CVar9;
          *(undefined8 *)(&pCVar1->csCoord + 2) = uVar5;
          pCVar1 = hintmap->edge + (uVar16 + 1);
          pCVar1->flags = FVar7;
          *(undefined4 *)&pCVar1->field_0x4 = uVar8;
          pCVar1->index = sVar4;
          hintmap->count = uVar15 + 2;
        }
      }
    }
  }
  return;
}

Assistant:

static void
  cf2_hintmap_insertHint( CF2_HintMap  hintmap,
                          CF2_Hint     bottomHintEdge,
                          CF2_Hint     topHintEdge )
  {
    CF2_UInt  indexInsert;

    /* set default values, then check for edge hints */
    FT_Bool   isPair         = TRUE;
    CF2_Hint  firstHintEdge  = bottomHintEdge;
    CF2_Hint  secondHintEdge = topHintEdge;


    /* one or none of the input params may be invalid when dealing with */
    /* edge hints; at least one edge must be valid                      */
    FT_ASSERT( cf2_hint_isValid( bottomHintEdge ) ||
               cf2_hint_isValid( topHintEdge )    );

    /* determine how many and which edges to insert */
    if ( !cf2_hint_isValid( bottomHintEdge ) )
    {
      /* insert only the top edge */
      firstHintEdge = topHintEdge;
      isPair        = FALSE;
    }
    else if ( !cf2_hint_isValid( topHintEdge ) )
    {
      /* insert only the bottom edge */
      isPair = FALSE;
    }

    /* paired edges must be in proper order */
    if ( isPair                                         &&
         topHintEdge->csCoord < bottomHintEdge->csCoord )
      return;

    /* linear search to find index value of insertion point */
    indexInsert = 0;
    for ( ; indexInsert < hintmap->count; indexInsert++ )
    {
      if ( hintmap->edge[indexInsert].csCoord >= firstHintEdge->csCoord )
        break;
    }

    FT_TRACE7(( "  Got hint at %.2f (%.2f)\n",
                firstHintEdge->csCoord / 65536.0,
                firstHintEdge->dsCoord / 65536.0 ));
    if ( isPair )
      FT_TRACE7(( "  Got hint at %.2f (%.2f)\n",
                  secondHintEdge->csCoord / 65536.0,
                  secondHintEdge->dsCoord / 65536.0 ));

    /*
     * Discard any hints that overlap in character space.  Most often, this
     * is while building the initial map, where captured hints from all
     * zones are combined.  Define overlap to include hints that `touch'
     * (overlap zero).  Hiragino Sans/Gothic fonts have numerous hints that
     * touch.  Some fonts have non-ideographic glyphs that overlap our
     * synthetic hints.
     *
     * Overlap also occurs when darkening stem hints that are close.
     *
     */
    if ( indexInsert < hintmap->count )
    {
      /* we are inserting before an existing edge:    */
      /* verify that an existing edge is not the same */
      if ( hintmap->edge[indexInsert].csCoord == firstHintEdge->csCoord )
        return; /* ignore overlapping stem hint */

      /* verify that a new pair does not straddle the next edge */
      if ( isPair                                                        &&
           hintmap->edge[indexInsert].csCoord <= secondHintEdge->csCoord )
        return; /* ignore overlapping stem hint */

      /* verify that we are not inserting between paired edges */
      if ( cf2_hint_isPairTop( &hintmap->edge[indexInsert] ) )
        return; /* ignore overlapping stem hint */
    }

    /* recompute device space locations using initial hint map */
    if ( cf2_hintmap_isValid( hintmap->initialHintMap ) &&
         !cf2_hint_isLocked( firstHintEdge )            )
    {
      if ( isPair )
      {
        /* Use hint map to position the center of stem, and nominal scale */
        /* to position the two edges.  This preserves the stem width.     */
        CF2_Fixed  midpoint =
                     cf2_hintmap_map(
                       hintmap->initialHintMap,
                       ADD_INT32(
                         firstHintEdge->csCoord,
                         SUB_INT32 ( secondHintEdge->csCoord,
                                     firstHintEdge->csCoord ) / 2 ) );
        CF2_Fixed  halfWidth =
                     FT_MulFix( SUB_INT32( secondHintEdge->csCoord,
                                           firstHintEdge->csCoord ) / 2,
                                hintmap->scale );


        firstHintEdge->dsCoord  = SUB_INT32( midpoint, halfWidth );
        secondHintEdge->dsCoord = ADD_INT32( midpoint, halfWidth );
      }
      else
        firstHintEdge->dsCoord = cf2_hintmap_map( hintmap->initialHintMap,
                                                  firstHintEdge->csCoord );
    }

    /*
     * Discard any hints that overlap in device space; this can occur
     * because locked hints have been moved to align with blue zones.
     *
     * TODO: Although we might correct this later during adjustment, we
     * don't currently have a way to delete a conflicting hint once it has
     * been inserted.  See v2.030 MinionPro-Regular, 12 ppem darkened,
     * initial hint map for second path, glyph 945 (the perispomeni (tilde)
     * in U+1F6E, Greek omega with psili and perispomeni).  Darkening is
     * 25.  Pair 667,747 initially conflicts in design space with top edge
     * 660.  This is because 667 maps to 7.87, and the top edge was
     * captured by a zone at 8.0.  The pair is later successfully inserted
     * in a zone without the top edge.  In this zone it is adjusted to 8.0,
     * and no longer conflicts with the top edge in design space.  This
     * means it can be included in yet a later zone which does have the top
     * edge hint.  This produces a small mismatch between the first and
     * last points of this path, even though the hint masks are the same.
     * The density map difference is tiny (1/256).
     *
     */

    if ( indexInsert > 0 )
    {
      /* we are inserting after an existing edge */
      if ( firstHintEdge->dsCoord < hintmap->edge[indexInsert - 1].dsCoord )
        return;
    }

    if ( indexInsert < hintmap->count )
    {
      /* we are inserting before an existing edge */
      if ( isPair )
      {
        if ( secondHintEdge->dsCoord > hintmap->edge[indexInsert].dsCoord )
          return;
      }
      else
      {
        if ( firstHintEdge->dsCoord > hintmap->edge[indexInsert].dsCoord )
          return;
      }
    }

    /* make room to insert */
    {
      CF2_UInt  iSrc = hintmap->count - 1;
      CF2_UInt  iDst = isPair ? hintmap->count + 1 : hintmap->count;

      CF2_UInt  count = hintmap->count - indexInsert;


      if ( iDst >= CF2_MAX_HINT_EDGES )
      {
        FT_TRACE4(( "cf2_hintmap_insertHint: too many hintmaps\n" ));
        return;
      }

      while ( count-- )
        hintmap->edge[iDst--] = hintmap->edge[iSrc--];

      /* insert first edge */
      hintmap->edge[indexInsert] = *firstHintEdge;         /* copy struct */
      hintmap->count            += 1;

      FT_TRACE7(( "  Inserting hint %.2f (%.2f)\n",
                  firstHintEdge->csCoord / 65536.0,
                  firstHintEdge->dsCoord / 65536.0 ));

      if ( isPair )
      {
        /* insert second edge */
        hintmap->edge[indexInsert + 1] = *secondHintEdge;  /* copy struct */
        hintmap->count                += 1;

        FT_TRACE7(( "  Inserting hint %.2f (%.2f)\n",
                    secondHintEdge->csCoord / 65536.0,
                    secondHintEdge->dsCoord / 65536.0 ));

      }
    }

    return;
  }